

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  AllocationPolicy *policy;
  SizedPtr SVar1;
  GetDeallocator local_28;
  GetDeallocator deallocator;
  ThreadSafeArena *this_local;
  
  deallocator.dealloc_ = (_func_void_void_ptr_size_t *)this;
  policy = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
  anon_unknown_12::GetDeallocator::GetDeallocator(&local_28,policy);
  WalkSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::Free()::__0>(this,&local_28);
  SVar1 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                    (&this->first_arena_,local_28);
  return SVar1;
}

Assistant:

SizedPtr ThreadSafeArena::Free() {
  auto deallocator = GetDeallocator(alloc_policy_.get());

  WalkSerialArenaChunk([&](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last. Freeing
    // in reverse-order to the order in which objects were created may not be
    // necessary to Free and we should revisit this. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      // Always frees the first block of "serial" as it cannot be user-provided.
      SizedPtr mem = serial->Free(deallocator);
      ABSL_DCHECK_NE(mem.p, nullptr);
      deallocator(mem);
    }

    // Delete the chunk as we're done with it.
    internal::SizedDelete(chunk,
                          SerialArenaChunk::AllocSize(chunk->capacity()));
  });

  // The first block of the first arena is special and let the caller handle it.
  return first_arena_.Free(deallocator);
}